

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O0

S2CellId s2textformat::MakeCellIdOrDie(string_view str)

{
  bool bVar1;
  ostream *poVar2;
  absl *this;
  S2CellId *in_RCX;
  size_type sVar3;
  string_view str_00;
  string_view piece;
  S2LogMessage local_48;
  S2LogMessageVoidify local_31;
  s2textformat *local_30;
  char *local_28;
  s2textformat *psStack_20;
  string_view str_local;
  S2CellId cell_id;
  
  str_local.ptr_ = (char *)str.length_;
  psStack_20 = (s2textformat *)str.ptr_;
  S2CellId::S2CellId((S2CellId *)&str_local.length_);
  local_30 = psStack_20;
  local_28 = str_local.ptr_;
  str_00.length_ = (size_type)&str_local.length_;
  str_00.ptr_ = str_local.ptr_;
  bVar1 = MakeCellId(psStack_20,str_00,in_RCX);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return (S2CellId)str_local.length_;
  }
  sVar3 = 3;
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
             ,0x8f,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_48);
  poVar2 = std::operator<<(poVar2,"Check failed: MakeCellId(str, &cell_id) ");
  this = (absl *)std::operator<<(poVar2,": str == \"");
  piece.length_ = sVar3;
  piece.ptr_ = str_local.ptr_;
  poVar2 = absl::operator<<(this,(ostream *)psStack_20,piece);
  poVar2 = std::operator<<(poVar2,"\"");
  S2LogMessageVoidify::operator&(&local_31,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_48);
}

Assistant:

S2CellId MakeCellIdOrDie(string_view str) {
  S2CellId cell_id;
  S2_CHECK(MakeCellId(str, &cell_id)) << ": str == \"" << str << "\"";
  return cell_id;
}